

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void TrackGlobalIntAssignmentsForknopDotProps
               (ParseNodePtr knopDotNode,ByteCodeGenerator *byteCodeGenerator)

{
  AssignmentState AVar1;
  ParseNode *pnode;
  Symbol *pSVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId PVar5;
  undefined4 *puVar6;
  ParseNodeBin *pPVar7;
  ParseNodeName *this;
  ParseNodeName *pPVar8;
  
  if (knopDotNode->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b26,"(knopDotNode->nop == knopDot)","knopDotNode->nop == knopDot");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pPVar7 = ParseNode::AsParseNodeBin(knopDotNode);
  pnode = pPVar7->pnode1;
  pPVar7 = ParseNode::AsParseNodeBin(knopDotNode);
  this = ParseNode::AsParseNodeName(pPVar7->pnode2);
  if (pnode->nop == knopName) {
    bVar4 = ByteCodeGenerator::IsThis(pnode);
    if (bVar4) {
      AVar1 = this->pid->assignmentState;
      PVar5 = ParseNodeName::PropertyIdFromNameNode(this);
      if (AVar1 == AssignedOnce) {
        Js::ScriptContext::TrackIntConstPropertyOnGlobalObject
                  (byteCodeGenerator->scriptContext,PVar5);
        return;
      }
    }
    else {
      pPVar8 = ParseNode::AsParseNodeName(pnode);
      pSVar2 = pPVar8->sym;
      if (((pSVar2 == (Symbol *)0x0) || ((pSVar2->field_0x42 & 8) == 0)) ||
         (pSVar2->assignmentState != AssignedOnce)) {
        ParseNodeName::PropertyIdFromNameNode(this);
        return;
      }
      AVar1 = this->pid->assignmentState;
      PVar5 = ParseNodeName::PropertyIdFromNameNode(this);
      if (AVar1 == AssignedOnce) {
        Js::ScriptContext::TrackIntConstPropertyOnGlobalUserObject
                  (byteCodeGenerator->scriptContext,PVar5);
        return;
      }
    }
  }
  return;
}

Assistant:

void TrackGlobalIntAssignmentsForknopDotProps(ParseNodePtr knopDotNode, ByteCodeGenerator * byteCodeGenerator)
{
    Assert(knopDotNode->nop == knopDot);

    ParseNodePtr objectNode = knopDotNode->AsParseNodeBin()->pnode1;
    ParseNodeName * propertyNode = knopDotNode->AsParseNodeBin()->pnode2->AsParseNodeName();
    bool isSymGlobalAndSingleAssignment = false;

    if (objectNode->nop == knopName)
    {
        if (ByteCodeGenerator::IsThis(objectNode))
        {
            // Assume 'this' always refer to GlobalObject
            // Cases like "this.a = "
            isSymGlobalAndSingleAssignment = propertyNode->pid->IsSingleAssignment();
            Js::PropertyId propertyId = propertyNode->PropertyIdFromNameNode();
            TrackIntConstantsOnGlobalObject(byteCodeGenerator, isSymGlobalAndSingleAssignment, propertyId);
        }
        else
        {
            Symbol * sym = objectNode->AsParseNodeName()->sym;
            isSymGlobalAndSingleAssignment = sym && sym->GetIsGlobal() && sym->IsAssignedOnce() && propertyNode->pid->IsSingleAssignment();
            Js::PropertyId propertyId = propertyNode->PropertyIdFromNameNode();
            TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, isSymGlobalAndSingleAssignment, propertyId);
        }
    }
}